

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printDescription
          (PrinterStream *this,vector<soul::Type,_std::allocator<soul::Type>_> *types)

{
  Type *type_00;
  CodePrinter *pCVar1;
  pointer pTVar2;
  bool bVar3;
  Type *type;
  pointer type_01;
  string local_50;
  
  type_00 = (types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = this->out;
  if ((long)(types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)type_00 == 0x18) {
    getTypeDescription_abi_cxx11_(&local_50,this,type_00);
    choc::text::CodePrinter::operator<<(pCVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    choc::text::CodePrinter::operator<<(pCVar1,'(');
    pTVar2 = (types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar3 = true;
    for (type_01 = (types->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start; type_01 != pTVar2; type_01 = type_01 + 1) {
      if (!bVar3) {
        choc::text::CodePrinter::operator<<(this->out,", ");
      }
      pCVar1 = this->out;
      getTypeDescription_abi_cxx11_(&local_50,this,type_01);
      choc::text::CodePrinter::operator<<(pCVar1,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = false;
    }
    choc::text::CodePrinter::operator<<(this->out,')');
  }
  return;
}

Assistant:

void printDescription (const std::vector<Type>& types)
        {
            if (types.size() == 1)
            {
                out << getTypeDescription (types[0]);
                return;
            }

            out << '(';
            bool first = true;

            for (auto& type : types)
            {
                if (! first)
                    out << ", ";

                out << getTypeDescription (type);
                first = false;
            }

            out << ')';
        }